

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::add_sample
          (TypedTimeSamples<tinyusdz::value::normal3f> *this,double t,normal3f *v)

{
  undefined1 local_38 [8];
  Sample s;
  normal3f *v_local;
  double t_local;
  TypedTimeSamples<tinyusdz::value::normal3f> *this_local;
  
  s._16_8_ = v;
  Sample::Sample((Sample *)local_38);
  s.t = *(double *)s._16_8_;
  s.value.x = *(float *)(s._16_8_ + 8);
  local_38 = (undefined1  [8])t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample,std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::normal3f>::Sample>>
              *)this,(Sample *)local_38);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }